

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O2

void __thiscall gimage::PNGImageIO::load(PNGImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  undefined1 *puVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  __jmp_buf_tag *__env;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  IOException *pIVar12;
  ulong uVar13;
  size_t __n;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong h;
  allocator local_91;
  png_structp png;
  png_infop info;
  png_infop end;
  string local_78;
  long local_58;
  void *local_50;
  PNGReadData dp;
  
  iVar5 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[0xd])(this,data,length);
  if ((char)iVar5 == '\0') {
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_78,"Can only load PNG image format",(allocator *)&dp);
    gutil::IOException::IOException(pIVar12,&local_78);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_read_struct("1.6.37",0,0);
  if (png == (png_structp)0x0) {
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_78,"Cannot allocate handle for reading PNG files",(allocator *)&dp);
    gutil::IOException::IOException(pIVar12,&local_78);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  dp.i = 0;
  dp.data = data;
  dp.length = length;
  png_set_read_fn(png,&dp,anon_unknown_2::readPNGData);
  info = (png_infop)png_create_info_struct(png);
  if (info == (png_infop)0x0) {
    png_destroy_read_struct(&png,0);
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_78,"Cannot allocate PNG info structure",(allocator *)&end);
    gutil::IOException::IOException(pIVar12,&local_78);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  end = (png_infop)png_create_info_struct(png);
  if (end != (png_infop)0x0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
    iVar5 = _setjmp(__env);
    if (iVar5 != 0) {
      png_destroy_read_struct(&png,&info,&end);
      pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_78,"Cannot read PNG image from memory",&local_91);
      gutil::IOException::IOException(pIVar12,&local_78);
      __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    png_read_info(png,info);
    uVar6 = png_get_image_width(png,info);
    uVar7 = png_get_image_height(png,info);
    h = (ulong)uVar7;
    bVar3 = png_get_color_type(png,info);
    lVar16 = 4;
    if (bVar3 != 6) {
      lVar16 = (ulong)((bVar3 & 0xfe) == 2) * 2 + 1;
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,(ulong)uVar6,h,lVar16);
    sVar2 = image->n;
    __n = -sVar2;
    if (0 < (long)sVar2) {
      __n = sVar2;
    }
    memset(image->pixel,0,__n);
    if (bVar3 == 3) {
      png_set_palette_to_rgb(png);
    }
    bVar4 = png_get_bit_depth(png,info);
    if (bVar4 < 9) {
      local_58 = lVar16;
      if (bVar4 != 8 && bVar3 == 0) {
        png_set_expand_gray_1_2_4_to_8(png);
      }
      iVar5 = png_get_rowbytes(png,info);
      uVar8 = (long)iVar5 * h;
      uVar13 = 0xffffffffffffffff;
      if (-1 < (long)uVar8) {
        uVar13 = uVar8;
      }
      pvVar9 = operator_new__(uVar13);
      pvVar10 = operator_new__(h * 8);
      lVar16 = local_58;
      pvVar11 = pvVar9;
      for (uVar13 = 0; h != uVar13; uVar13 = uVar13 + 1) {
        *(void **)((long)pvVar10 + uVar13 * 8) = pvVar11;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar5);
      }
      local_50 = pvVar9;
      png_read_image(png,pvVar10);
      for (uVar13 = 0; uVar13 != h; uVar13 = uVar13 + 1) {
        uVar14 = 0;
        uVar8 = uVar14;
        for (; uVar14 != uVar6; uVar14 = uVar14 + 1) {
          uVar8 = (ulong)(int)uVar8;
          for (uVar15 = 0; (uint)((int)lVar16 << 3) != uVar15; uVar15 = uVar15 + 8) {
            puVar1 = (undefined1 *)(*(long *)((long)pvVar10 + uVar13 * 8) + uVar8);
            uVar8 = uVar8 + 1;
            *(undefined1 *)(*(long *)(*(long *)((long)image->img + uVar15) + uVar13 * 8) + uVar14) =
                 *puVar1;
          }
        }
      }
      operator_delete__(pvVar10);
      operator_delete__(local_50);
      png_destroy_read_struct(&png,&info,&end);
      return;
    }
    png_destroy_read_struct(&png,&info,&end);
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_78,"PNG image with <= 8 bits expected",&local_91);
    gutil::IOException::IOException(pIVar12,&local_78);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_destroy_read_struct(&png,&info,0);
  pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_78,"Cannot allocate PNG info structure",&local_91);
  gutil::IOException::IOException(pIVar12,&local_78);
  __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNGImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length) const
{
  if (!handles(data, length))
  {
    throw gutil::IOException("Can only load PNG image format");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  PNGReadData dp;
  dp.data=data;
  dp.length=length;
  dp.i=0;

  png_set_read_fn(png, &dp, readPNGData);

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("Cannot read PNG image from memory");
  }

  // read header data

  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB)
  {
    depth=3;
  }

  if (color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=4;
  }

  image.setSize(width, height, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("PNG image with <= 8 bits expected");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  for (long k=0; k<height; k++)
  {
    int j=0;

    for (long i=0; i<width; i++)
    {
      for (int d=0; d<depth; d++)
      {
        image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
}